

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::anon_unknown_0::ReconstructCollectionProperties
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *table,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *properties,Collection *coll,string *warn,string *err,
               bool strict_allowedToken_check)

{
  _Rb_tree_node_base *str;
  _Base_ptr *this;
  uint uVar1;
  pointer pSVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  PrimVar *this_00;
  bool bVar6;
  __type _Var7;
  int iVar8;
  code *pcVar9;
  size_type sVar10;
  CollectionInstance *pCVar11;
  ostream *poVar12;
  ExpansionRule *value;
  value_type_conflict *pvVar13;
  value_type *pvVar14;
  _Base_ptr p_Var15;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  _Base_ptr p_Var17;
  undefined4 uVar18;
  long lVar19;
  char *pcVar20;
  optional<tinyusdz::Relationship> *this_01;
  TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *result;
  undefined7 in_register_00000089;
  _Base_ptr p_Var21;
  ulong uVar22;
  optional<bool> pv_3;
  allocator local_621;
  ParseResult ret;
  undefined1 local_5f0 [48];
  double local_5c0;
  undefined4 local_5b8;
  undefined4 local_5b4;
  Animatable<bool> animatable_value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  optional<bool> pv;
  string instance_name;
  storage_union local_528 [2];
  PrimVar *local_508;
  _Base_ptr local_500;
  _Base_ptr local_4f8;
  _Rb_tree_node_base *local_4f0;
  function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ExpansionRuleEnumHandler;
  string attr_type_name;
  ostringstream ss_w;
  undefined2 uStack_49f;
  undefined1 uStack_49d;
  undefined1 local_498 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_490 [23];
  string local_318;
  string suffix;
  function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2d8;
  ostringstream ss_e;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_b0;
  optional<tinyusdz::Animatable<bool>> local_98 [48];
  bool local_68;
  bool local_38;
  
  ExpansionRuleEnumHandler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  ExpansionRuleEnumHandler.super__Function_base._M_functor._8_8_ = 0;
  ExpansionRuleEnumHandler._M_invoker =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:2642:131)>
       ::_M_invoke;
  pcVar9 = ::std::
           _Function_handler<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:2642:131)>
           ::_M_manager;
  ExpansionRuleEnumHandler.super__Function_base._M_manager =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:2642:131)>
       ::_M_manager;
  if (coll == (Collection *)0x0) {
    uVar18 = 0;
  }
  else {
    local_5b8 = (undefined4)CONCAT71(in_register_00000089,strict_allowedToken_check);
    local_4f0 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    result = (TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *)err;
    p_Var21 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      local_5b4 = (undefined4)CONCAT71((int7)((ulong)pcVar9 >> 8),p_Var21 == local_4f0);
      if (p_Var21 == local_4f0) break;
      str = p_Var21 + 1;
      ::std::__cxx11::string::string((string *)&ss_e,"collection:",(allocator *)&ss_w);
      bVar6 = startsWith((string *)str,(string *)&ss_e);
      ::std::__cxx11::string::_M_dispose();
      if ((bVar6) &&
         (sVar10 = ::std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::count(table,(key_type *)str), sVar10 == 0)) {
        ::std::__cxx11::string::string((string *)&ss_e,"collection:",(allocator *)&ss_w);
        removePrefix((string *)&suffix,(string *)str,(string *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::string((string *)&ss_e,":",(allocator *)&ss_w);
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x147ae14;
        split(&names,&suffix,(string *)&ss_e,0x147ae14);
        ::std::__cxx11::string::_M_dispose();
        if ((long)names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x40) {
          if ((names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar12 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar12 = ::std::operator<<(poVar12,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       );
            poVar12 = ::std::operator<<(poVar12,":");
            poVar12 = ::std::operator<<(poVar12,"ReconstructCollectionProperties");
            poVar12 = ::std::operator<<(poVar12,"():");
            poVar12 = (ostream *)::std::ostream::operator<<(poVar12,0xa6d);
            ::std::operator<<(poVar12," ");
            pcVar20 = "INSTANCE_NAME is empty for collection property name";
          }
          else {
            if (names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length != 0) {
              ::std::__cxx11::string::string
                        ((string *)&instance_name,
                         (string *)
                         names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
              bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(names.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1),
                                        "includes");
              if (bVar6) {
                if (((ulong)p_Var21[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                  pCVar11 = ordered_dict<tinyusdz::CollectionInstance>::get_or_add
                                      (&coll->_instances,&instance_name);
                  this_01 = &pCVar11->includes;
LAB_001c129f:
                  nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                            (this_01,(Relationship *)&p_Var21[0x17]._M_left);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)str);
LAB_001c2093:
                  iVar8 = 0;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar12 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar12 = ::std::operator<<(poVar12,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                             );
                  poVar12 = ::std::operator<<(poVar12,":");
                  poVar12 = ::std::operator<<(poVar12,"ReconstructCollectionProperties");
                  poVar12 = ::std::operator<<(poVar12,"():");
                  iVar8 = 0xa78;
LAB_001c1521:
                  poVar12 = (ostream *)::std::ostream::operator<<(poVar12,iVar8);
                  ::std::operator<<(poVar12," ");
                  ::std::__cxx11::string::string
                            ((string *)local_5f0,"`{}` must be a Relationship",
                             (allocator *)&animatable_value);
                  fmt::format<std::__cxx11::string>
                            ((string *)&ss_w,(fmt *)local_5f0,(string *)str,args);
                  poVar12 = ::std::operator<<((ostream *)&ss_e,(string *)&ss_w);
                  ::std::operator<<(poVar12,"\n");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ss_w,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_5f0,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
                    ::std::__cxx11::string::operator=((string *)err,(string *)&ss_w);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_001c15de:
                  iVar8 = 1;
                }
              }
              else {
                bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(names.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 1),
                                          "expansionRule");
                if (!bVar6) {
                  bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(names.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + 1),
                                            "includeRoot");
                  if (!bVar6) {
                    bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(names.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1),
                                              "excludes");
                    if (bVar6) {
                      if (((ulong)p_Var21[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                        poVar12 = ::std::operator<<((ostream *)&ss_e,"[error]");
                        poVar12 = ::std::operator<<(poVar12,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                        poVar12 = ::std::operator<<(poVar12,":");
                        poVar12 = ::std::operator<<(poVar12,"ReconstructCollectionProperties");
                        poVar12 = ::std::operator<<(poVar12,"():");
                        iVar8 = 0xa96;
                        goto LAB_001c1521;
                      }
                      pCVar11 = ordered_dict<tinyusdz::CollectionInstance>::get_or_add
                                          (&coll->_instances,&instance_name);
                      this_01 = &pCVar11->excludes;
                      goto LAB_001c129f;
                    }
                    goto LAB_001c2093;
                  }
                  aaStack_490[0]._M_local_buf[8] = '\0';
                  aaStack_490._9_8_ = 0;
                  local_498 = (undefined1  [8])0x0;
                  aaStack_490[0]._M_local_buf[0] = '\0';
                  aaStack_490[0]._M_allocated_capacity._1_7_ = 0;
                  stack0xfffffffffffffb62 = (ushort)((uint)_ss_w >> 0x10) & 0xff00;
                  _ss_w = 0x100;
                  TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::
                  TypedAttributeWithFallback
                            ((TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)&ss_e,
                             (Animatable<bool> *)&ss_w);
                  ::std::
                  _Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                  ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                   *)local_498);
                  ::std::__cxx11::string::string((string *)&local_318,(string *)str);
                  ret.err._M_dataplus._M_p = (pointer)&ret.err.field_2;
                  ret.err._M_string_length = 0;
                  ret.err.field_2._M_local_buf[0] = '\0';
                  iVar8 = ::std::__cxx11::string::compare((string *)&local_318);
                  if (iVar8 == 0) {
                    if (((ulong)p_Var21[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                      ret.code = PropertyTypeMismatch;
                      ::std::__cxx11::string::string
                                ((string *)local_5f0,
                                 "Property {} must be Attribute, but declared as Relationhip.",
                                 (allocator *)&animatable_value);
                      fmt::format<std::__cxx11::string>
                                ((string *)&ss_w,(fmt *)local_5f0,(string *)str,args);
                      ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_w);
                      ::std::__cxx11::string::_M_dispose();
                    }
                    else {
                      Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)(p_Var21 + 2));
                      tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
                      _Var7 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&ss_w,&attr_type_name);
                      if (_Var7) {
                        ::std::__cxx11::string::_M_dispose();
                      }
                      else {
                        tinyusdz::value::TypeTraits<bool>::underlying_type_name_abi_cxx11_();
                        _Var7 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_5f0,&attr_type_name);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        if (!_Var7) {
                          ret.code = TypeMismatch;
                          ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_w);
                          poVar12 = ::std::operator<<((ostream *)(local_498 + 8),
                                                      "Property type mismatch. ");
                          poVar12 = ::std::operator<<(poVar12,(string *)str);
                          poVar12 = ::std::operator<<(poVar12," expects type `");
                          tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
                          poVar12 = ::std::operator<<(poVar12,(string *)local_5f0);
                          poVar12 = ::std::operator<<(poVar12,"` but defined as type `");
                          poVar12 = ::std::operator<<(poVar12,(string *)&attr_type_name);
                          ::std::operator<<(poVar12,"`");
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::stringbuf::str();
                          ::std::__cxx11::string::operator=((string *)&ret.err,(string *)local_5f0);
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_w);
                          goto LAB_001c2036;
                        }
                      }
                      p_Var17 = p_Var21[6]._M_parent;
                      local_4f8 = p_Var21[6]._M_left;
                      local_500 = p_Var17;
                      if (local_4f8 != p_Var17) {
                        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                                  (&local_b0,
                                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                   &p_Var21[6]._M_parent);
                      }
                      iVar8 = *(int *)((long)&p_Var21[0x17]._M_parent + 4);
                      if (iVar8 == 1) {
                        bVar6 = Attribute::is_blocked((Attribute *)(p_Var21 + 2));
                        if (bVar6) {
                          local_38 = true;
                        }
                        else if (p_Var21[3]._M_color == _S_black) {
                          bVar6 = primvar::PrimVar::is_timesamples((PrimVar *)&p_Var21[4]._M_parent)
                          ;
                          if (bVar6) {
                            ret.code = VariabilityMismatch;
                            ::std::__cxx11::string::string
                                      ((string *)local_5f0,
                                       "TimeSample value is assigned to `uniform` property `{}",
                                       (allocator *)&animatable_value);
                            fmt::format<std::__cxx11::string>
                                      ((string *)&ss_w,(fmt *)local_5f0,(string *)str,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)p_Var17);
                            ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_w);
                          }
                          else {
                            Attribute::get_value<bool>((Attribute *)&ss_w);
                            pv.has_value_ = (bool)ss_w;
                            if (ss_w == (ostringstream)0x1) {
                              pv.contained = (storage_t<bool>)(undefined1)uStack_49f;
                              pvVar13 = nonstd::optional_lite::optional<bool>::value(&pv);
                              uVar1 = (uint)_ss_w >> 0x18;
                              local_498 = (undefined1  [8])0x0;
                              aaStack_490[0]._M_local_buf[0] = '\0';
                              aaStack_490[0]._M_allocated_capacity._1_7_ = 0;
                              aaStack_490[0]._M_local_buf[8] = '\0';
                              aaStack_490._9_8_ = 0;
                              _ss_w = CONCAT21(1,*pvVar13);
                              _ss_w = CONCAT13((char)uVar1,_ss_w);
                              nonstd::optional_lite::optional<tinyusdz::Animatable<bool>>::operator=
                                        (local_98,(Animatable<bool> *)&ss_w);
                              ::std::
                              _Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                              ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                               *)local_498);
                              goto LAB_001c1b56;
                            }
                            ret.code = TypeMismatch;
                            ::std::__cxx11::string::string
                                      ((string *)local_5f0,
                                       "Fallback. Failed to retrieve value with requested type `{}`."
                                       ,(allocator *)local_528);
                            tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
                            fmt::format<std::__cxx11::string>
                                      ((string *)&ss_w,(fmt *)local_5f0,(string *)&animatable_value,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)p_Var17);
                            ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_w);
                            ::std::__cxx11::string::_M_dispose();
                          }
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                          goto LAB_001c2036;
                        }
LAB_001c1b56:
                        animatable_value._value = false;
                        animatable_value._has_value = false;
                        animatable_value._blocked = false;
                        animatable_value._ts._samples.
                        super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                        animatable_value._ts._17_8_ = 0;
                        animatable_value._ts._samples.
                        super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        animatable_value._ts._samples.
                        super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                        animatable_value._ts._samples.
                        super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                        this = &p_Var21[4]._M_parent;
                        local_508 = (PrimVar *)this;
                        if (p_Var21[5]._M_left == p_Var21[5]._M_parent) {
                          bVar6 = false;
LAB_001c1d7b:
                          bVar5 = bVar6;
                          this_00 = local_508;
                          bVar6 = primvar::PrimVar::has_value(local_508);
                          if (bVar6) {
                            primvar::PrimVar::get_value<bool>((PrimVar *)&ss_w);
                            pv_3.has_value_ = (bool)ss_w;
                            if (ss_w != (ostringstream)0x1) {
                              ret.code = InternalError;
                              ::std::__cxx11::string::string
                                        ((string *)local_5f0,
                                         "Internal error. Invalid attribute value? get_value<{}> failed. Attribute has type {}"
                                         ,&local_621);
                              tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
                              primvar::PrimVar::type_name_abi_cxx11_((string *)local_528,this_00);
                              fmt::format<std::__cxx11::string,std::__cxx11::string>
                                        ((string *)&ss_w,(fmt *)local_5f0,(string *)&pv,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_528,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)result);
                              ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_w);
                              ::std::__cxx11::string::_M_dispose();
                              ::std::__cxx11::string::_M_dispose();
                              ::std::__cxx11::string::_M_dispose();
                              ::std::__cxx11::string::_M_dispose();
                              bVar3 = false;
                              bVar4 = false;
                              bVar6 = true;
                              goto LAB_001c1fac;
                            }
                            pv_3.contained = (storage_t<bool>)(undefined1)uStack_49f;
                            pvVar13 = nonstd::optional_lite::optional<bool>::value(&pv_3);
                            animatable_value._has_value = true;
                            animatable_value._blocked = false;
                            animatable_value._value = *pvVar13;
                            bVar3 = true;
                          }
                          else {
                            bVar3 = false;
                          }
                          if ((bVar5) || (bVar3)) {
                            nonstd::optional_lite::optional<tinyusdz::Animatable<bool>>::operator=
                                      (local_98,&animatable_value);
                          }
                          bVar4 = true;
                          bVar6 = false;
                        }
                        else {
                          _ss_w = _ss_w & 0xff000000;
                          aaStack_490[0]._M_local_buf[8] = '\0';
                          aaStack_490._9_8_ = 0;
                          local_498 = (undefined1  [8])0x0;
                          aaStack_490[0]._M_local_buf[0] = '\0';
                          aaStack_490[0]._M_allocated_capacity._1_7_ = 0;
                          bVar6 = primvar::PrimVar::is_valid((PrimVar *)this);
                          if (bVar6) {
                            bVar6 = primvar::PrimVar::has_value((PrimVar *)this);
                            if (bVar6) {
                              primvar::PrimVar::get_value<bool>((PrimVar *)local_528);
                              pv.has_value_ = (bool)local_528[0]._0_1_;
                              if (local_528[0]._0_1_ != '\x01') goto LAB_001c1e1d;
                              pv.contained = (storage_t<bool>)local_528[0]._1_1_;
                              pvVar13 = nonstd::optional_lite::optional<bool>::value(&pv);
                              uStack_49f = 1;
                              ss_w = (ostringstream)*pvVar13;
                              p_Var17 = p_Var21[5]._M_parent;
                              p_Var15 = p_Var21[5]._M_left;
                              if (p_Var15 != p_Var17) goto LAB_001c1e34;
                            }
                            else {
LAB_001c1e1d:
                              p_Var17 = p_Var21[5]._M_parent;
                              p_Var15 = p_Var21[5]._M_left;
                              if (p_Var15 == p_Var17) {
                                local_5f0[0] = (string)0x0;
                                local_5f0._24_8_ = 0;
                                local_5f0._32_8_ = 0;
                                local_5f0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                                local_5f0._16_8_ = 0;
                                local_5f0._40_8_ = 0;
                                goto LAB_001c1c89;
                              }
LAB_001c1e34:
                              lVar19 = 0;
                              for (uVar22 = 0;
                                  uVar22 < (ulong)(((long)p_Var15 - (long)p_Var17) / 0x28);
                                  uVar22 = uVar22 + 1) {
                                pvVar16 = tinyusdz::value::TimeSamples::get_samples
                                                    ((TimeSamples *)&p_Var21[5]._M_parent);
                                pSVar2 = (pvVar16->
                                         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                         )._M_impl.super__Vector_impl_data._M_start;
                                if ((&pSVar2->blocked)[lVar19] == true) {
                                  TypedTimeSamples<bool>::add_blocked_sample
                                            ((TypedTimeSamples<bool> *)local_498,
                                             *(double *)((long)&pSVar2->t + lVar19));
                                }
                                else {
                                  tinyusdz::value::Value::get_value<bool>
                                            ((Value *)local_528,
                                             (bool)((char)pSVar2 + (char)lVar19 + '\b'));
                                  pv.has_value_ = (bool)local_528[0]._0_1_;
                                  if (local_528[0]._0_1_ != '\x01') goto LAB_001c1c84;
                                  pv.contained = (storage_t<bool>)local_528[0]._1_1_;
                                  local_5c0 = *(double *)((long)&pSVar2->t + lVar19);
                                  pvVar13 = nonstd::optional_lite::optional<bool>::value(&pv);
                                  TypedTimeSamples<bool>::add_sample
                                            ((TypedTimeSamples<bool> *)local_498,local_5c0,pvVar13);
                                }
                                p_Var17 = p_Var21[5]._M_parent;
                                p_Var15 = p_Var21[5]._M_left;
                                lVar19 = lVar19 + 0x28;
                              }
                            }
                            nonstd::optional_lite::optional<tinyusdz::Animatable<bool>_>::
                            optional<tinyusdz::Animatable<bool>,_0>
                                      ((optional<tinyusdz::Animatable<bool>_> *)local_5f0,
                                       (Animatable<bool> *)&ss_w);
                          }
                          else {
LAB_001c1c84:
                            local_5f0._40_8_ = 0;
                            local_5f0._32_8_ = 0;
                            local_5f0._24_8_ = 0;
                            local_5f0._16_8_ = 0;
                            local_5f0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                            local_5f0[0] = (string)0x0;
                          }
LAB_001c1c89:
                          ::std::
                          _Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                          ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                           *)local_498);
                          nonstd::optional_lite::optional<tinyusdz::Animatable<bool>_>::
                          optional<tinyusdz::Animatable<bool>,_0>
                                    ((optional<tinyusdz::Animatable<bool>_> *)&ss_w,
                                     (optional<tinyusdz::Animatable<bool>_> *)local_5f0);
                          nonstd::optional_lite::optional<tinyusdz::Animatable<bool>_>::~optional
                                    ((optional<tinyusdz::Animatable<bool>_> *)local_5f0);
                          local_5c0 = (double)CONCAT71(local_5c0._1_7_,ss_w);
                          if (ss_w == (ostringstream)0x1) {
                            pvVar14 = nonstd::optional_lite::optional<tinyusdz::Animatable<bool>_>::
                                      value((optional<tinyusdz::Animatable<bool>_> *)&ss_w);
                            Animatable<bool>::operator=(&animatable_value,pvVar14);
                          }
                          else {
                            ret.code = InternalError;
                            ::std::__cxx11::string::string
                                      ((string *)&pv,
                                       "Converting timeSamples Attribute data failed for `{}`. Guess TimeSamples have values with different type(expected is `{}`)?"
                                       ,(allocator *)&pv_3);
                            tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
                            fmt::format<std::__cxx11::string,std::__cxx11::string>
                                      ((string *)local_5f0,(fmt *)&pv,&local_318,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_528,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)result);
                            ::std::__cxx11::string::operator=
                                      ((string *)&ret.err,(string *)local_5f0);
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::string::_M_dispose();
                          }
                          nonstd::optional_lite::optional<tinyusdz::Animatable<bool>_>::~optional
                                    ((optional<tinyusdz::Animatable<bool>_> *)&ss_w);
                          bVar6 = true;
                          bVar3 = false;
                          bVar5 = false;
                          bVar4 = false;
                          if (local_5c0._0_1_ != '\0') goto LAB_001c1d7b;
                        }
LAB_001c1fac:
                        ::std::
                        _Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                        ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                         *)&animatable_value._ts);
                        if (bVar4) goto LAB_001c1fd1;
                        ::std::__cxx11::string::_M_dispose();
                        if (bVar6) goto LAB_001c203b;
                      }
                      else {
                        if (iVar8 == 0) {
                          local_68 = true;
                        }
                        else {
                          bVar3 = false;
                          bVar5 = false;
LAB_001c1fd1:
                          if (local_4f8 == local_500) {
                            if ((!bVar5) && (!bVar3)) {
                              ::std::__cxx11::string::assign((char *)&ret.err);
                              ret.code = InternalError;
                              goto LAB_001c2036;
                            }
                          }
                          else if ((!bVar5) && (!bVar3)) {
                            local_68 = true;
                          }
                        }
                        AttrMetas::operator=((AttrMetas *)&ss_e,(AttrMetas *)(p_Var21 + 7));
                        ::std::
                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::_M_insert_unique<std::__cxx11::string_const&>
                                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                    *)table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)str);
                        ret.code = Success;
                      }
                    }
LAB_001c2036:
                    ::std::__cxx11::string::_M_dispose();
                  }
                  else {
                    ret.code = Unmatched;
                  }
LAB_001c203b:
                  ::std::__cxx11::string::_M_dispose();
                  if (AlreadyProcessed < ret.code) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_w);
                    poVar12 = ::std::operator<<((ostream *)&ss_w,"[error]");
                    poVar12 = ::std::operator<<(poVar12,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                               );
                    poVar12 = ::std::operator<<(poVar12,":");
                    poVar12 = ::std::operator<<(poVar12,"ReconstructCollectionProperties");
                    poVar12 = ::std::operator<<(poVar12,"():");
                    poVar12 = (ostream *)::std::ostream::operator<<(poVar12,0xa8d);
                    ::std::operator<<(poVar12," ");
                    ::std::__cxx11::string::string
                              ((string *)&animatable_value,
                               "Parsing attribute `{}` failed. Error: {}",
                               (allocator *)&attr_type_name);
                    fmt::format<std::__cxx11::string,std::__cxx11::string>
                              ((string *)local_5f0,(fmt *)&animatable_value,(string *)str,&ret.err,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               result);
                    poVar12 = ::std::operator<<((ostream *)&ss_w,(string *)local_5f0);
                    ::std::operator<<(poVar12,"\n");
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    if (err != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_5f0,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&animatable_value,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)err);
                      ::std::__cxx11::string::operator=((string *)err,(string *)local_5f0);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_w);
                    ::std::__cxx11::string::_M_dispose();
                    TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::
                    ~TypedAttributeWithFallback
                              ((TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)&ss_e);
                    goto LAB_001c15de;
                  }
                  ::std::__cxx11::string::_M_dispose();
                  sVar10 = ::std::
                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::count(table,(key_type *)str);
                  if (sVar10 != 0) {
                    pCVar11 = ordered_dict<tinyusdz::CollectionInstance>::get_or_add
                                        (&coll->_instances,&instance_name);
                    TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::operator=
                              (&pCVar11->includeRoot,
                               (TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)&ss_e);
                  }
                  TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::
                  ~TypedAttributeWithFallback
                            ((TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)&ss_e);
                  goto LAB_001c2093;
                }
                _ss_w = 0;
                TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::
                TypedAttributeWithFallback
                          ((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                            *)&ss_e,(ExpansionRule *)&ss_w);
                _Var7 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)str);
                sVar10 = ::std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::count(table,(key_type *)str);
                if (_Var7) {
                  iVar8 = 3;
                  if (sVar10 == 0) {
                    Property::value_type_name_abi_cxx11_((string *)&ss_w,(Property *)(p_Var21 + 2));
                    tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                    _Var7 = ::std::operator==((string *)&ss_w,
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_5f0);
                    if ((_Var7) &&
                       (uVar1 = *(uint *)((long)&p_Var21[0x17]._M_parent + 4), uVar1 < 2)) {
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      if (uVar1 == 0) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_w);
                        poVar12 = ::std::operator<<((ostream *)&ss_w,"[warn]");
                        poVar12 = ::std::operator<<(poVar12,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                        poVar12 = ::std::operator<<(poVar12,":");
                        poVar12 = ::std::operator<<(poVar12,"ReconstructCollectionProperties");
                        poVar12 = ::std::operator<<(poVar12,"():");
                        poVar12 = (ostream *)::std::ostream::operator<<(poVar12,0xa84);
                        ::std::operator<<(poVar12," ");
                        poVar12 = ::std::operator<<((ostream *)&ss_w,"No value assigned to `");
                        poVar12 = ::std::operator<<(poVar12,(string *)str);
                        poVar12 = ::std::operator<<(poVar12,
                                                  "` token attribute. Set default token value.");
                        ::std::operator<<(poVar12,"\n");
                        if (warn != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_5f0,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&animatable_value,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)err);
                          ::std::__cxx11::string::operator=((string *)warn,(string *)local_5f0);
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_w);
                        AttrMetas::operator=((AttrMetas *)&ss_e,(AttrMetas *)(p_Var21 + 7));
                        ::std::
                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::_M_insert_unique<std::__cxx11::string_const&>
                                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                    *)table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)str);
                        iVar8 = 3;
                        goto LAB_001c16db;
                      }
                    }
                    else {
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                    }
                    result = (TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                              *)&ss_e;
                    ::std::
                    function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    ::function((function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                *)&ss_w,&ExpansionRuleEnumHandler);
                    ::std::
                    function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    ::function(&local_2d8,
                               (function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                *)&ss_w);
                    bVar6 = ParseUniformEnumProperty<tinyusdz::CollectionInstance::ExpansionRule,tinyusdz::CollectionInstance::ExpansionRule>
                                      ((string *)str,local_5b8._0_1_,&local_2d8,
                                       (Attribute *)(p_Var21 + 2),result,warn,err);
                    if (local_2d8.super__Function_base._M_manager != (_Manager_type)0x0) {
                      (*local_2d8.super__Function_base._M_manager)(&local_2d8,&local_2d8,3);
                    }
                    iVar8 = 1;
                    if (bVar6) {
                      AttrMetas::operator=((AttrMetas *)&ss_e,(AttrMetas *)(p_Var21 + 7));
                      ::std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)str);
                      iVar8 = 3;
                    }
                    if ((code *)CONCAT71(aaStack_490[0]._M_allocated_capacity._1_7_,
                                         aaStack_490[0]._M_local_buf[0]) != (code *)0x0) {
                      (*(code *)CONCAT71(aaStack_490[0]._M_allocated_capacity._1_7_,
                                         aaStack_490[0]._M_local_buf[0]))(&ss_w,&ss_w,3);
                    }
                  }
                }
                else {
                  iVar8 = 0;
                  if (sVar10 != 0) {
                    pCVar11 = ordered_dict<tinyusdz::CollectionInstance>::get_or_add
                                        (&coll->_instances,&instance_name);
                    value = TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                            ::get_value((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                                         *)&ss_e);
                    TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::
                    operator=(&pCVar11->expansionRule,value);
                  }
                }
LAB_001c16db:
                TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::
                ~TypedAttributeWithFallback
                          ((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                            *)&ss_e);
                if (iVar8 == 0) goto LAB_001c2093;
              }
              ::std::__cxx11::string::_M_dispose();
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&names);
              ::std::__cxx11::string::_M_dispose();
              if ((iVar8 == 3) || (iVar8 == 0)) goto LAB_001c20c7;
              break;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar12 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar12 = ::std::operator<<(poVar12,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       );
            poVar12 = ::std::operator<<(poVar12,":");
            poVar12 = ::std::operator<<(poVar12,"ReconstructCollectionProperties");
            poVar12 = ::std::operator<<(poVar12,"():");
            poVar12 = (ostream *)::std::ostream::operator<<(poVar12,0xa70);
            ::std::operator<<(poVar12," ");
            pcVar20 = "Collection property name is empty";
          }
          poVar12 = ::std::operator<<((ostream *)&ss_e,pcVar20);
          ::std::operator<<(poVar12,"\n");
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar12 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar12 = ::std::operator<<(poVar12,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar12 = ::std::operator<<(poVar12,":");
          poVar12 = ::std::operator<<(poVar12,"ReconstructCollectionProperties");
          poVar12 = ::std::operator<<(poVar12,"():");
          poVar12 = (ostream *)::std::ostream::operator<<(poVar12,0xa6a);
          ::std::operator<<(poVar12," ");
          ::std::__cxx11::string::string
                    ((string *)local_5f0,
                     "Invalid collection property name. Must be \'collection:INSTANCE_NAME:<prop_name>\' but got \'{}\'"
                     ,(allocator *)&animatable_value);
          fmt::format<std::__cxx11::string>((string *)&ss_w,(fmt *)local_5f0,(string *)str,args);
          poVar12 = ::std::operator<<((ostream *)&ss_e,(string *)&ss_w);
          ::std::operator<<(poVar12,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_w,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_5f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)err,(string *)&ss_w);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&names);
        ::std::__cxx11::string::_M_dispose();
        break;
      }
LAB_001c20c7:
      pcVar9 = (code *)::std::_Rb_tree_increment(p_Var21);
      p_Var21 = (_Base_ptr)pcVar9;
    }
    uVar18 = local_5b4;
    if (ExpansionRuleEnumHandler.super__Function_base._M_manager == (_Manager_type)0x0)
    goto LAB_001c2657;
  }
  (*ExpansionRuleEnumHandler.super__Function_base._M_manager)
            ((_Any_data *)&ExpansionRuleEnumHandler,(_Any_data *)&ExpansionRuleEnumHandler,
             __destroy_functor);
LAB_001c2657:
  return SUB41(uVar18,0);
}

Assistant:

bool ReconstructCollectionProperties(
  std::set<std::string> &table, /* inout */
  const std::map<std::string, Property> &properties,
  Collection *coll, /* inout */
  std::string *warn,
  std::string *err,
  bool strict_allowedToken_check)
{
  constexpr auto kCollectionPrefix = "collection:";

  std::function<nonstd::expected<CollectionInstance::ExpansionRule, std::string>(const std::string &)> ExpansionRuleEnumHandler = [](const std::string &tok) {
  //auto ExpansionRuleEnumHandler = [](const std::string &tok) {
    using EnumTy = std::pair<CollectionInstance::ExpansionRule, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(CollectionInstance::ExpansionRule::ExplicitOnly, kExplicitOnly),
        std::make_pair(CollectionInstance::ExpansionRule::ExpandPrims, kExpandPrims),
        std::make_pair(CollectionInstance::ExpansionRule::ExpandPrimsAndProperties, kExpandPrimsAndProperties),
    };
    return EnumHandler<CollectionInstance::ExpansionRule>("expansionRule", tok, enums);
  };

  if (!coll) {
    return false;
  }

  for (const auto &prop : properties) {
    if (startsWith(prop.first, kCollectionPrefix)) {
      if (table.count(prop.first)) {
         continue;
      }

      std::string suffix = removePrefix(prop.first, kCollectionPrefix);
      std::vector<std::string> names = split(suffix, ":");
      if (names.size() != 2) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid collection property name. Must be 'collection:INSTANCE_NAME:<prop_name>' but got '{}'",  prop.first));
      }
      if (names[0].empty()) {
        PUSH_ERROR_AND_RETURN("INSTANCE_NAME is empty for collection property name");
      }
      if (names[1].empty()) {
        PUSH_ERROR_AND_RETURN("Collection property name is empty");
      }

      std::string instance_name = names[0];

      if (names[1] == "includes") {

        if (!prop.second.is_relationship()) {
          PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
        }

        CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
        coll_instance.includes = prop.second.get_relationship();
        table.insert(prop.first);

      } else if (names[1] == "expansionRule") {

        TypedAttributeWithFallback<CollectionInstance::ExpansionRule> r{CollectionInstance::ExpansionRule::ExpandPrims};

        PARSE_UNIFORM_ENUM_PROPERTY(table, prop, prop.first, CollectionInstance::ExpansionRule, ExpansionRuleEnumHandler, CollectionInstance,
                       r, strict_allowedToken_check)

        if (table.count(prop.first)) {
          CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
          coll_instance.expansionRule = r.get_value();
        }
      } else if (names[1] == "includeRoot") {

        TypedAttributeWithFallback<Animatable<bool>> includeRoot{false};
        PARSE_TYPED_ATTRIBUTE_NOCONTINUE(table, prop, prop.first, CollectionInstance, includeRoot)

        if (table.count(prop.first)) {
          CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
          coll_instance.includeRoot = includeRoot;
        }
      } else if (names[1] == "excludes") {

        if (!prop.second.is_relationship()) {
          PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
        }

        CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
        coll_instance.excludes = prop.second.get_relationship();
        table.insert(prop.first);

      }
    }
  }

  return true;
}